

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint LD_AwareHash1(uchar *data,uint n)

{
  uint hardener;
  uint scale;
  uint hash;
  uint n_local;
  uchar *data_local;
  
  hash = 0x172a550d;
  data_local = data;
  for (n_local = n; n_local != 0; n_local = n_local - 1) {
    hash = (uint)*data_local + hash * 0x172a554f;
    data_local = data_local + 1;
  }
  return hash ^ 0x46253dc2;
}

Assistant:

static unsigned int LD_AwareHash1(const unsigned char* data, unsigned int n) {
	unsigned int hash = 388650253;
	unsigned int scale = 388650319;
	unsigned int hardener = 1176845762;
	while (n) {
		hash *= scale;
		hash += *data++;
		n--;
	}
	return hash ^ hardener;
}